

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void sort_actions(void)

{
  int iVar1;
  Yshort *pYVar2;
  Yshort *pYVar3;
  Yshort *pYVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  
  pYVar4 = (Yshort *)allocate(nvectors << 2);
  pYVar3 = width;
  pYVar2 = tally;
  nentries = 0;
  lVar5 = (long)nvectors;
  order = pYVar4;
  if (0 < lVar5) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      iVar1 = pYVar2[lVar9];
      if (0 < iVar1) {
        uVar13 = (ulong)uVar10;
        uVar8 = (ulong)uVar10;
        do {
          uVar13 = uVar13 - 1;
          iVar11 = ((int)uVar10 >> 0x1f & uVar10) - 1;
          if ((int)uVar8 < 1) goto LAB_001114cf;
          uVar6 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar6;
        } while (pYVar3[pYVar4[uVar13 & 0xffffffff]] < pYVar3[lVar9]);
        do {
          iVar7 = (int)uVar8;
          iVar11 = iVar7;
          if ((pYVar3[pYVar4[uVar8]] != pYVar3[lVar9]) || (iVar1 <= pYVar2[pYVar4[uVar8]])) break;
          uVar8 = (ulong)(iVar7 - 1);
          iVar11 = ((int)uVar6 >> 0x1f & uVar6) - 1;
        } while (0 < iVar7);
LAB_001114cf:
        if (iVar11 < (int)(uVar10 - 1)) {
          lVar12 = (long)(int)(uVar10 - 1);
          uVar6 = uVar10;
          do {
            pYVar4[(int)uVar6] = pYVar4[lVar12];
            lVar12 = lVar12 + -1;
            uVar6 = uVar6 - 1;
          } while (iVar11 < lVar12);
        }
        pYVar4[(long)iVar11 + 1] = (Yshort)lVar9;
        uVar10 = uVar10 + 1;
        nentries = uVar10;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar5);
  }
  return;
}

Assistant:

void sort_actions()
{
  register int i;
  register int j;
  register int k;
  register int t;
  register int w;

  order = NEW2(nvectors, Yshort);
  nentries = 0;

  for (i = 0; i < nvectors; i++)
    {
      if (tally[i] > 0)
	{
	  t = tally[i];
	  w = width[i];
	  j = nentries - 1;

	  while (j >= 0 && (width[order[j]] < w))
	    j--;

	  while (j >= 0 && (width[order[j]] == w) && (tally[order[j]] < t))
	    j--;

	  for (k = nentries - 1; k > j; k--)
	    order[k + 1] = order[k];

	  order[j + 1] = i;
	  nentries++;
	}
    }
}